

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp.h
# Opt level: O2

void __thiscall
iir_filter<3>::iir_filter
          (iir_filter<3> *this,double gain,array<double,_4UL> *b,array<double,_4UL> *a)

{
  double dVar1;
  double dVar2;
  double dVar3;
  allocator_type local_2a;
  allocator_type local_29;
  
  this->gain_m = gain;
  dVar1 = b->_M_elems[1];
  dVar2 = b->_M_elems[2];
  dVar3 = b->_M_elems[3];
  (this->b_m)._M_elems[0] = b->_M_elems[0];
  (this->b_m)._M_elems[1] = dVar1;
  (this->b_m)._M_elems[2] = dVar2;
  (this->b_m)._M_elems[3] = dVar3;
  dVar1 = a->_M_elems[1];
  dVar2 = a->_M_elems[2];
  dVar3 = a->_M_elems[3];
  (this->a_m)._M_elems[0] = a->_M_elems[0];
  (this->a_m)._M_elems[1] = dVar1;
  (this->a_m)._M_elems[2] = dVar2;
  (this->a_m)._M_elems[3] = dVar3;
  boost::circular_buffer<double,_std::allocator<double>_>::circular_buffer<int>
            (&this->xv_m,4,0,&local_29);
  boost::circular_buffer<double,_std::allocator<double>_>::circular_buffer<int>
            (&this->yv_m,4,0,&local_2a);
  if ((a->_M_elems[0] != 1.0) || (NAN(a->_M_elems[0]))) {
    __assert_fail("a[0] == 1.0",
                  "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/dsp.h",0xf7,
                  "iir_filter<3>::iir_filter(double, const std::array<double, ORDER + 1> &, const std::array<double, ORDER + 1> &) [ORDER = 3]"
                 );
  }
  if ((((b->_M_elems[0] == b->_M_elems[3]) && (!NAN(b->_M_elems[0]) && !NAN(b->_M_elems[3]))) &&
      (b->_M_elems[1] == b->_M_elems[2])) && (!NAN(b->_M_elems[1]) && !NAN(b->_M_elems[2]))) {
    return;
  }
  __assert_fail("b[ii] == b[b.size() - ii - 1]",
                "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/dsp.h",0xf9,
                "iir_filter<3>::iir_filter(double, const std::array<double, ORDER + 1> &, const std::array<double, ORDER + 1> &) [ORDER = 3]"
               );
}

Assistant:

explicit iir_filter(double gain, const std::array<double, ORDER + 1>& b,
                        const std::array<double, ORDER + 1>& a)
      : gain_m(gain)
      , b_m(b)
      , a_m(a)
      , xv_m(ORDER + 1, 0)
      , yv_m(ORDER + 1, 0)
    {
        assert(a[0] == 1.0);
        for (size_t ii(0); ii != (ORDER + 1) / 2; ++ii)
            assert(b[ii] == b[b.size() - ii - 1]);
    }